

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O3

void __thiscall QDecompressHelper::feed(QDecompressHelper *this,QByteArray *data)

{
  qint64 *pqVar1;
  long lVar2;
  QDecompressHelper *pQVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  QArrayData *pQVar7;
  bool bVar8;
  QByteArray *data_00;
  
  lVar2 = (data->d).size;
  this->totalCompressedBytes = this->totalCompressedBytes + lVar2;
  if (lVar2 != 0) {
    pqVar1 = &(this->compressedDataBuffer).bufferCompleteSize;
    *pqVar1 = *pqVar1 + lVar2;
    QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
              ((QMovableArrayOps<QByteArray> *)this,(this->compressedDataBuffer).buffers.d.size,data
              );
    QList<QByteArray>::end((QList<QByteArray> *)this);
  }
  data_00 = QByteDataBuffer::operator[]
                      (&this->compressedDataBuffer,(this->compressedDataBuffer).buffers.d.size + -1)
  ;
  bVar8 = countInternal(this,data_00);
  if (bVar8) {
    return;
  }
  if (((this->errorStr).d.size == 0) &&
     (pQVar3 = (this->countHelper)._M_t.
               super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>.
               _M_t.
               super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>.
               super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl,
     pQVar3 != (QDecompressHelper *)0x0)) {
    pDVar4 = (pQVar3->errorStr).d.d;
    pcVar5 = *(char16_t **)((long)&(pQVar3->errorStr).d + 8);
    qVar6 = *(qsizetype *)((long)&(pQVar3->errorStr).d + 0x10);
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar7 = &((this->errorStr).d.d)->super_QArrayData;
    (this->errorStr).d.d = pDVar4;
    (this->errorStr).d.ptr = pcVar5;
    (this->errorStr).d.size = qVar6;
    if (pQVar7 != (QArrayData *)0x0) {
      LOCK();
      (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar7,2,0x10);
      }
    }
  }
  clear(this);
  return;
}

Assistant:

void QDecompressHelper::feed(QByteArray &&data)
{
    Q_ASSERT(contentEncoding != None);
    totalCompressedBytes += data.size();
    compressedDataBuffer.append(std::move(data));
    if (!countInternal(compressedDataBuffer[compressedDataBuffer.bufferCount() - 1])) {
        if (errorStr.isEmpty() && countHelper)
            errorStr = countHelper->errorString();
        clear(); // If our counting brother failed then so will we :|
    }
}